

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

bool __thiscall
SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Prepend
          (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *this,
          Recycler *allocator,JavascriptPromiseReactionPair *data)

{
  JavascriptPromiseReaction *pJVar1;
  Recycler *alloc;
  SListNodeBase<Memory::Recycler> *ptr;
  undefined1 local_48 [8];
  TrackAllocData data_1;
  
  local_48 = (undefined1  [8])
             &SListNode<Js::JavascriptPromiseReactionPair,Memory::Recycler>::typeinfo;
  data_1.typeinfo = (type_info *)0x0;
  data_1.plusSize = 0xffffffffffffffff;
  data_1.count = (size_t)anon_var_dwarf_121a46;
  data_1.filename._0_4_ = 0x13b;
  alloc = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_48);
  ptr = (SListNodeBase<Memory::Recycler> *)new<Memory::Recycler>(0x18,alloc,0x37ff80);
  (ptr->next).ptr = (SListNodeBase<Memory::Recycler> *)0x0;
  pJVar1 = data->rejectReaction;
  ptr[1].next.ptr = (SListNodeBase<Memory::Recycler> *)data->resolveReaction;
  ptr[2].next.ptr = (SListNodeBase<Memory::Recycler> *)pJVar1;
  Memory::WriteBarrierPtr<SListNodeBase<Memory::Recycler>_>::operator=
            ((WriteBarrierPtr<SListNodeBase<Memory::Recycler>_> *)ptr,
             (WriteBarrierPtr<SListNodeBase<Memory::Recycler>_> *)this);
  Memory::WriteBarrierPtr<SListNodeBase<Memory::Recycler>_>::WriteBarrierSet
            ((WriteBarrierPtr<SListNodeBase<Memory::Recycler>_> *)this,ptr);
  (this->super_RealCount).count = (this->super_RealCount).count + 1;
  return true;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }